

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdSplit.cpp
# Opt level: O0

int CmdSplit(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  bool bVar1;
  bool bVar2;
  string *this;
  size_type sVar3;
  size_type sVar4;
  reference piVar5;
  string *__return_storage_ptr__;
  time_t tVar6;
  ostream *poVar7;
  undefined1 auStack_3a8 [8];
  Datetime midpoint_1;
  Datetime midpoint;
  Interval second;
  Interval first;
  Interval *interval_1;
  iterator __end1;
  iterator __begin1;
  vector<Interval,_std::allocator<Interval>_> *__range1;
  string local_1a0;
  reference local_180;
  Interval *interval;
  iterator __end3;
  iterator __begin3;
  vector<Interval,_std::allocator<Interval>_> *__range3;
  bool found;
  int *id;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  vector<Interval,_std::allocator<Interval>_> intervals;
  undefined1 local_f0 [8];
  IntervalFilterAllWithIds filtering;
  undefined1 local_98 [8];
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  Journal *pJStack_28;
  bool verbose;
  Journal *journal_local;
  Database *database_local;
  Rules *rules_local;
  CLI *cli_local;
  
  pJStack_28 = journal;
  journal_local = (Journal *)database;
  database_local = (Database *)rules;
  rules_local = (Rules *)cli;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"verbose",&local_51);
  bVar1 = Rules::getBoolean(rules,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_29 = bVar1;
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)local_98,(CLI *)rules_local);
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  if (bVar1) {
    filtering._id_end._M_node._6_1_ = 1;
    this = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,"IDs must be specified. See \'timew help split\'.",
               (allocator<char> *)((long)&filtering._id_end._M_node + 7));
    filtering._id_end._M_node._6_1_ = 0;
    __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(pJStack_28);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            ((IntervalFilterAllWithIds *)local_f0,
             (set<int,_std::less<int>,_std::allocator<int>_> *)
             &intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  getTracked((vector<Interval,_std::allocator<Interval>_> *)&__range2,(Database *)journal_local,
             (Rules *)database_local,(IntervalFilter *)local_f0);
  sVar3 = std::vector<Interval,_std::allocator<Interval>_>::size
                    ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
  sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  if (sVar3 != sVar4) {
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
    id = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&id), bVar1) {
      piVar5 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      bVar1 = false;
      __end3 = std::vector<Interval,_std::allocator<Interval>_>::begin
                         ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
      interval = (Interval *)
                 std::vector<Interval,_std::allocator<Interval>_>::end
                           ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                                         *)&interval), bVar2) {
        local_180 = __gnu_cxx::
                    __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                    ::operator*(&__end3);
        if (local_180->id == *piVar5) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
        ::operator++(&__end3);
      }
      if (!bVar1) {
        __range1._6_1_ = 1;
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a0,"ID \'@{1}\' does not correspond to any tracking.",
                   (allocator<char> *)((long)&__range1 + 7));
        format<int>(__return_storage_ptr__,&local_1a0,*piVar5);
        __range1._6_1_ = 0;
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
  }
  __end1 = std::vector<Interval,_std::allocator<Interval>_>::begin
                     ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
  interval_1 = (Interval *)
               std::vector<Interval,_std::allocator<Interval>_>::end
                         ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                                     *)&interval_1), bVar1) {
    first._tags._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
                 operator*(&__end1);
    Interval::Interval((Interval *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (Interval *)first._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Interval::Interval((Interval *)&midpoint._date,
                       (Interval *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = Range::is_open((Range *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar1) {
      Datetime::Datetime((Datetime *)&midpoint_1._date);
      tVar6 = Datetime::operator-((Datetime *)&midpoint_1._date,(Datetime *)&first);
      Datetime::operator-=((Datetime *)&midpoint_1._date,tVar6 / 2);
      memcpy(&first.super_Range.start._date,&midpoint_1._date,0x30);
      memcpy(&second,&midpoint_1._date,0x30);
    }
    else {
      midpoint_1._seconds = first.super_Range.start._seconds;
      midpoint_1._offset = first.super_Range.start._offset;
      midpoint_1._utc = first.super_Range.start._utc;
      midpoint_1._33_7_ = first.super_Range.start._33_7_;
      midpoint_1._week = first.super_Range.start._week;
      midpoint_1._weekday = first.super_Range.start._weekday;
      midpoint_1._julian = first.super_Range.start._julian;
      midpoint_1._day = first.super_Range.start._day;
      auStack_3a8 = (undefined1  [8])first.super_Range._vptr_Range;
      midpoint_1._year = first.super_Range.start._year;
      midpoint_1._month = first.super_Range.start._month;
      tVar6 = Datetime::operator-((Datetime *)&first.super_Range.start._date,(Datetime *)&first);
      Datetime::operator+=((Datetime *)auStack_3a8,tVar6 / 2);
      memcpy(&first.super_Range.start._date,auStack_3a8,0x30);
      memcpy(&second,auStack_3a8,0x30);
    }
    Database::deleteInterval
              ((Database *)journal_local,
               (Interval *)first._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    validate((CLI *)rules_local,(Rules *)database_local,(Database *)journal_local,
             (Interval *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Database::addInterval
              ((Database *)journal_local,
               (Interval *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (bool)(local_29 & 1));
    validate((CLI *)rules_local,(Rules *)database_local,(Database *)journal_local,
             (Interval *)&midpoint._date);
    Database::addInterval
              ((Database *)journal_local,(Interval *)&midpoint._date,(bool)(local_29 & 1));
    if ((local_29 & 1) != 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Split @");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(int *)(first._tags._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + 0x68));
      std::operator<<(poVar7,'\n');
    }
    Interval::~Interval((Interval *)&midpoint._date);
    Interval::~Interval((Interval *)&second._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
    operator++(&__end1);
  }
  Journal::endTransaction(pJStack_28);
  std::vector<Interval,_std::allocator<Interval>_>::~vector
            ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
  IntervalFilterAllWithIds::~IntervalFilterAllWithIds((IntervalFilterAllWithIds *)local_f0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  return 0;
}

Assistant:

int CmdSplit (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  std::set <int> ids = cli.getIds ();

  if (ids.empty ())
  {
    throw std::string ("IDs must be specified. See 'timew help split'.");
  }

  journal.startTransaction ();

  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  for (const auto& interval : intervals)
  {
    Interval first = interval;
    Interval second = first;

    if (first.is_open ())
    {
      Datetime midpoint;
      midpoint -= (midpoint - first.start) / 2;
      first.end = midpoint;
      second.start = midpoint;
    }
    else
    {
      Datetime midpoint = first.start;
      midpoint += (first.end - first.start) / 2;
      first.end = midpoint;
      second.start = midpoint;
    }

    database.deleteInterval (interval);

    validate (cli, rules, database, first);
    database.addInterval (first, verbose);

    validate (cli, rules, database, second);
    database.addInterval (second, verbose);

    if (verbose)
    {
      std::cout << "Split @" << interval.id << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}